

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthCountOnesInCofsSlow(uint *pTruth,int nVars,int *pStore,uint *pAux)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (0 < nVars) {
    uVar1 = 1 << ((char)nVars - 5U & 0x1f);
    if ((uint)nVars < 6) {
      uVar1 = 1;
    }
    uVar6 = 0;
    do {
      iVar3 = (int)uVar6;
      Kit_TruthCofactor0New(pAux,pTruth,nVars,iVar3);
      if ((int)uVar1 < 1) {
        pStore[uVar6 * 2] = 0;
        Kit_TruthCofactor1New(pAux,pTruth,nVars,iVar3);
        iVar3 = 0;
      }
      else {
        iVar2 = 0;
        uVar4 = (ulong)uVar1 + 1;
        do {
          uVar5 = (pAux[uVar4 - 2] >> 1 & 0x55555555) + (pAux[uVar4 - 2] & 0x55555555);
          uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
          uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
          uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
          iVar2 = iVar2 + (uVar5 >> 0x10) + (uVar5 & 0xffff);
          uVar4 = uVar4 - 1;
        } while (1 < uVar4);
        pStore[uVar6 * 2] = iVar2 / 2;
        Kit_TruthCofactor1New(pAux,pTruth,nVars,iVar3);
        if ((int)uVar1 < 1) {
          iVar3 = 0;
        }
        else {
          iVar3 = 0;
          uVar4 = (ulong)uVar1 + 1;
          do {
            uVar5 = (pAux[uVar4 - 2] >> 1 & 0x55555555) + (pAux[uVar4 - 2] & 0x55555555);
            uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
            uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
            uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
            iVar3 = iVar3 + (uVar5 >> 0x10) + (uVar5 & 0xffff);
            uVar4 = uVar4 - 1;
          } while (1 < uVar4);
          iVar3 = iVar3 / 2;
        }
      }
      pStore[uVar6 * 2 + 1] = iVar3;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nVars);
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofsSlow( unsigned * pTruth, int nVars, int * pStore, unsigned * pAux )
{
    int i;
    for ( i = 0; i < nVars; i++ )
    {
        Kit_TruthCofactor0New( pAux, pTruth, nVars, i );
        pStore[2*i+0] = Kit_TruthCountOnes( pAux, nVars ) / 2;
        Kit_TruthCofactor1New( pAux, pTruth, nVars, i );
        pStore[2*i+1] = Kit_TruthCountOnes( pAux, nVars ) / 2;
    }
}